

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::PrefixIncDec(SQCompiler *this,SQInteger token)

{
  long lVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  bool bVar4;
  undefined7 uVar5;
  SQInteger arg0;
  SQInteger arg1;
  SQInteger arg0_00;
  SQOpcode _op;
  SQFuncState *this_00;
  long arg3;
  SQExpState es;
  
  Lex(this);
  bVar4 = (this->_es).donot_get;
  uVar5 = *(undefined7 *)&(this->_es).field_0x11;
  SVar2 = (this->_es).etype;
  SVar3 = (this->_es).epos;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  lVar1 = (this->_es).etype;
  if (4 < lVar1 - 1U) goto LAB_00111537;
  arg3 = (ulong)(token != 0x130) * 2 + -1;
  switch(lVar1) {
  case 1:
    Error(this,"can\'t \'++\' or \'--\' an expression");
    goto LAB_00111537;
  default:
    Emit2ArgsOP(this,_OP_INC,arg3);
    goto LAB_00111537;
  case 4:
    arg1 = SQFuncState::TopTarget(this->_fs);
    this_00 = this->_fs;
    _op = _OP_INCL;
    arg0 = 0;
    arg0_00 = arg1;
    break;
  case 5:
    arg0 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,arg0,(this->_es).epos,0,0);
    SQFuncState::AddInstruction(this->_fs,_OP_INCL,arg0,arg0,0,arg3);
    this_00 = this->_fs;
    arg1 = (this->_es).epos;
    _op = _OP_SETOUTER;
    arg3 = 0;
    arg0_00 = arg0;
  }
  SQFuncState::AddInstruction(this_00,_op,arg0_00,arg1,arg0,arg3);
LAB_00111537:
  (this->_es).donot_get = bVar4;
  *(undefined7 *)&(this->_es).field_0x11 = uVar5;
  (this->_es).etype = SVar2;
  (this->_es).epos = SVar3;
  return;
}

Assistant:

void PrefixIncDec(SQInteger token)
    {
        SQExpState  es;
        SQInteger diff = (token==TK_MINUSMINUS) ? -1 : 1;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype==EXPR) {
            Error(_SC("can't '++' or '--' an expression"));
        }
        else if(_es.etype==OBJECT || _es.etype==BASE) {
            Emit2ArgsOP(_OP_INC, diff);
        }
        else if(_es.etype==LOCAL) {
            SQInteger src = _fs->TopTarget();
            _fs->AddInstruction(_OP_INCL, src, src, 0, diff);

        }
        else if(_es.etype==OUTER) {
            SQInteger tmp = _fs->PushTarget();
            _fs->AddInstruction(_OP_GETOUTER, tmp, _es.epos);
            _fs->AddInstruction(_OP_INCL,     tmp, tmp, 0, diff);
            _fs->AddInstruction(_OP_SETOUTER, tmp, _es.epos, tmp);
        }
        _es = es;
    }